

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::EdgeChainSimplifier::OutputAllEdges(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  pointer *pppVar1;
  ulong *puVar2;
  pointer piVar3;
  iterator iVar4;
  iterator iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer ppVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar15;
  int local_70;
  VertexId local_6c;
  long local_68;
  vector<int,std::allocator<int>> *local_60;
  vector<int,std::allocator<int>> *local_58;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_48;
  ulong local_40;
  VertexId local_34;
  
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar9 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_70 = v0;
  local_6c = v1;
  pVar15 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar9 + piVar3[v0],ppVar9 + piVar3[(long)v0 + 1]);
  ppVar9 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)pVar15.first - (long)ppVar9) >> 3);
  iVar10 = (int)((ulong)((long)pVar15.second - (long)ppVar9) >> 3);
  if (iVar6 != iVar10) {
    local_60 = (vector<int,std::allocator<int>> *)CONCAT44(local_60._4_4_,v0);
    local_48 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->new_input_edge_ids_;
    local_58 = (vector<int,std::allocator<int>> *)&this->new_edge_layers_;
    lVar13 = (long)iVar6;
    lVar14 = lVar13 * 8;
    local_68 = lVar13 * 4;
    lVar11 = 0;
    lVar12 = 0;
    local_40 = lVar14;
    local_34 = v1;
    do {
      iVar4._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppVar9 = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (iVar4._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  (local_48,iVar4,(pair<int,_int> *)((long)&ppVar9->first + lVar14));
      }
      else {
        *iVar4._M_current = *(pair<int,_int> *)((long)&ppVar9[lVar12].first + local_40);
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_70 = *(int *)((long)(this->g_->input_edge_id_set_ids_->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar12 * 4 + local_68);
      iVar5._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_50,iVar5,&local_70);
      }
      else {
        *iVar5._M_current = local_70;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      piVar3 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_58,iVar5,(int *)((long)piVar3 + lVar11 + local_68));
      }
      else {
        *iVar5._M_current = *(int *)((long)piVar3 + lVar12 * 4 + local_68);
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar7 = iVar6 + (int)lVar12;
      iVar8 = iVar6 + 0x3f + (int)lVar12;
      if (-1 < iVar7) {
        iVar8 = iVar7;
      }
      puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               (long)(iVar8 >> 6) +
               (ulong)((lVar13 + lVar12 & 0x800000000000003fU) < 0x8000000000000001) +
               0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)(lVar13 + lVar12) & 0x3f);
      lVar14 = lVar14 + 8;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 4;
    } while ((iVar6 - iVar10) + (int)lVar12 != 0);
    ppVar9 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    v1 = local_34;
    v0 = (VertexId)local_60;
  }
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_70 = v1;
  local_6c = v0;
  pVar15 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar9 + piVar3[v1],ppVar9 + piVar3[(long)v1 + 1]);
  ppVar9 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)pVar15.first - (long)ppVar9) >> 3);
  iVar10 = (int)((ulong)((long)pVar15.second - (long)ppVar9) >> 3);
  if (iVar6 != iVar10) {
    local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_58 = (vector<int,std::allocator<int>> *)&this->new_input_edge_ids_;
    local_60 = (vector<int,std::allocator<int>> *)&this->new_edge_layers_;
    lVar13 = (long)iVar6;
    lVar14 = lVar13 * 8;
    local_68 = (ulong)(uint)-iVar10 + lVar13;
    lVar12 = 0;
    local_40 = 0x800000000000003f;
    lVar11 = 0;
    local_48 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)lVar14;
    do {
      iVar4._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppVar9 = (this->g_->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (iVar4._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  (local_50,iVar4,(pair<int,_int> *)((long)&ppVar9->first + lVar14));
      }
      else {
        *iVar4._M_current = *(pair<int,_int> *)((long)&ppVar9[lVar11].first + (long)local_48);
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_70 = (this->g_->input_edge_id_set_ids_->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar13 + lVar11];
      iVar5._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_58,iVar5,&local_70);
      }
      else {
        *iVar5._M_current = local_70;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      piVar3 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_60,iVar5,(int *)((long)piVar3 + lVar12 + lVar13 * 4));
      }
      else {
        *iVar5._M_current = piVar3[lVar13 + lVar11];
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar8 = iVar6 + (int)lVar11;
      iVar10 = iVar6 + 0x3f + (int)lVar11;
      if (-1 < iVar8) {
        iVar10 = iVar8;
      }
      puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               (long)(iVar10 >> 6) +
               (ulong)((lVar13 + lVar11 & local_40) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)(lVar13 + lVar11) & 0x3f);
      lVar14 = lVar14 + 8;
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 4;
    } while ((int)local_68 + (int)lVar11 != 0);
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::OutputAllEdges(VertexId v0, VertexId v1) {
  for (EdgeId e : out_.edge_ids(v0, v1)) OutputEdge(e);
  for (EdgeId e : out_.edge_ids(v1, v0)) OutputEdge(e);
}